

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t header_pax_extensions
                  (archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  int64_t *piVar1;
  char cVar2;
  byte bVar3;
  wchar_t wVar4;
  int iVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  int64_t iVar12;
  byte *name;
  archive_acl *paVar13;
  long lVar14;
  dev_t dVar15;
  archive_string_conv *paVar16;
  archive_string *paVar17;
  int iVar18;
  char *p;
  uint uVar19;
  uint uVar20;
  archive_entry *paVar21;
  archive_entry *paVar22;
  size_t sVar23;
  uint uVar24;
  byte *pbVar25;
  archive_string *paVar26;
  char *pcVar27;
  byte *pbVar28;
  ulong uVar29;
  archive_entry *entry_00;
  char *pcVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int64_t s;
  long local_80;
  time_t local_78;
  archive_string *local_70;
  archive_string *local_68;
  archive_string *local_60;
  archive_string *local_58;
  archive_string *local_50;
  archive_entry *local_48;
  long local_40;
  char *local_38;
  
  wVar4 = read_body_to_string(a,(tar *)&tar->pax_header,(archive_string *)h,unconsumed,unconsumed);
  if (wVar4 != L'\0') {
    return wVar4;
  }
  wVar4 = tar_read_header(a,tar,entry,unconsumed);
  if ((wVar4 != L'\0') && (wVar4 != L'\xffffffec')) {
    return wVar4;
  }
  pcVar30 = (tar->pax_header).s;
  pcVar9 = (char *)strlen(pcVar30);
  tar->pax_hdrcharset_binary = 0;
  wVar8 = L'\0';
  (tar->entry_gname).length = 0;
  local_50 = &tar->entry_linkpath;
  (tar->entry_linkpath).length = 0;
  (tar->entry_pathname).length = 0;
  local_60 = &tar->entry_pathname_override;
  (tar->entry_pathname_override).length = 0;
  local_58 = &tar->entry_uname;
  (tar->entry_uname).length = 0;
  paVar17 = &tar->entry_pathname;
  paVar26 = &tar->entry_gname;
  if (pcVar9 != (char *)0x0) {
    piVar1 = &tar->sparse_offset;
    wVar8 = L'\0';
    do {
      paVar21 = (archive_entry *)(pcVar30 + (long)pcVar9);
      pcVar10 = pcVar30 + (long)pcVar9 + -1;
      uVar29 = 0;
      p = pcVar9;
      pcVar27 = pcVar30;
      do {
        cVar2 = *pcVar27;
        if (cVar2 == ' ') {
          paVar21 = (archive_entry *)(pcVar27 + 1);
          pcVar10 = pcVar27;
          break;
        }
        if ((byte)(cVar2 - 0x3aU) < 0xf6) {
          pcVar30 = "Ignoring malformed pax extended attributes";
          goto LAB_004348dd;
        }
        uVar29 = (ulong)(byte)(cVar2 - 0x30) + uVar29 * 10;
        if (999999 < uVar29) {
          pcVar30 = "Rejecting pax extended attribute > 1MB";
          goto LAB_004348dd;
        }
        pcVar27 = pcVar27 + 1;
        p = p + -1;
      } while (p != (char *)0x0);
      pcVar27 = (char *)(uVar29 - 1);
      if ((pcVar9 <= pcVar27) || (pcVar30[(long)pcVar27] != '\n')) {
        pcVar30 = "Ignoring malformed pax extended attribute";
LAB_004348dd:
        archive_set_error(&a->archive,-1,pcVar30);
        wVar7 = L'\xffffffec';
        goto LAB_004348f4;
      }
      pcVar30[(long)pcVar27] = '\0';
      entry_00 = paVar21;
      if (*(char *)&paVar21->archive == '=') {
        wVar7 = L'\xffffffff';
        goto LAB_004348f4;
      }
      do {
        paVar22 = entry_00;
        entry_00 = (archive_entry *)((long)&paVar22->archive + 1);
        local_38 = pcVar30;
        if (*(char *)&paVar22->archive == '\0') {
          pcVar30 = "Invalid pax extended attributes";
          goto LAB_004348dd;
        }
      } while (*(char *)&paVar22->archive != '=');
      *(char *)&paVar22->archive = '\0';
      bVar3 = *(byte *)&paVar21->archive;
      local_70 = paVar26;
      local_68 = paVar17;
      if (bVar3 < 0x61) {
        if (bVar3 == 0x47) {
          iVar5 = strcmp((char *)paVar21,"GNU.sparse.numblocks");
          if (iVar5 == 0) {
            *(undefined4 *)piVar1 = 0xffffffff;
            *(undefined4 *)((long)&tar->sparse_offset + 4) = 0xffffffff;
            *(undefined4 *)&tar->sparse_numbytes = 0xffffffff;
            *(undefined4 *)((long)&tar->sparse_numbytes + 4) = 0xffffffff;
            tar->sparse_gnu_major = 0;
            tar->sparse_gnu_minor = 0;
          }
          iVar5 = strcmp((char *)paVar21,"GNU.sparse.offset");
          if (iVar5 == 0) {
            sVar11 = strlen((char *)entry_00);
            iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
            tar->sparse_offset = iVar12;
            if (tar->sparse_numbytes != -1) {
              wVar6 = gnu_add_sparse_entry(a,tar,iVar12,tar->sparse_numbytes);
              wVar7 = L'\xffffffe2';
              if (wVar6 != L'\0') goto LAB_0043485e;
              *(undefined4 *)piVar1 = 0xffffffff;
              *(undefined4 *)((long)&tar->sparse_offset + 4) = 0xffffffff;
              *(undefined4 *)&tar->sparse_numbytes = 0xffffffff;
              *(undefined4 *)((long)&tar->sparse_numbytes + 4) = 0xffffffff;
            }
          }
          iVar5 = strcmp((char *)paVar21,"GNU.sparse.numbytes");
          if (iVar5 == 0) {
            sVar11 = strlen((char *)entry_00);
            iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
            tar->sparse_numbytes = iVar12;
            if (iVar12 != -1) {
              wVar6 = gnu_add_sparse_entry(a,tar,tar->sparse_offset,iVar12);
              wVar7 = L'\xffffffe2';
              if (wVar6 != L'\0') goto LAB_0043485e;
              *(undefined4 *)piVar1 = 0xffffffff;
              *(undefined4 *)((long)&tar->sparse_offset + 4) = 0xffffffff;
              *(undefined4 *)&tar->sparse_numbytes = 0xffffffff;
              *(undefined4 *)((long)&tar->sparse_numbytes + 4) = 0xffffffff;
            }
          }
          iVar5 = strcmp((char *)paVar21,"GNU.sparse.size");
          if (iVar5 == 0) {
            sVar11 = strlen((char *)entry_00);
            iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
            tar->realsize = iVar12;
            archive_entry_set_size(entry,iVar12);
          }
          iVar5 = strcmp((char *)paVar21,"GNU.sparse.map");
          if (iVar5 == 0) {
            tar->sparse_gnu_major = 0;
            tar->sparse_gnu_minor = 1;
            iVar12 = -1;
            paVar22 = entry_00;
            do {
              for (sVar23 = 0;
                  (cVar2 = *(char *)((long)&paVar22->archive + sVar23), cVar2 != '\0' &&
                  (cVar2 != ',')); sVar23 = sVar23 + 1) {
                if ((byte)(cVar2 - 0x3aU) < 0xf6) {
                  wVar7 = L'\xffffffec';
                  goto LAB_0043485e;
                }
              }
              local_48 = paVar22;
              local_40 = iVar12;
              iVar12 = tar_atol_base_n((char *)paVar22,sVar23,L'\n');
              if (local_40 < 0) {
                if (iVar12 < 0) goto LAB_0043489e;
              }
              else {
                if (iVar12 < 0) {
LAB_0043489e:
                  wVar7 = L'\xffffffec';
                  goto LAB_0043485e;
                }
                wVar6 = gnu_add_sparse_entry(a,tar,local_40,iVar12);
                iVar12 = -1;
                wVar7 = L'\xffffffec';
                if (wVar6 != L'\0') goto LAB_0043485e;
              }
              pcVar30 = (char *)((long)&local_48->archive + sVar23);
              paVar22 = (archive_entry *)(pcVar30 + 1);
            } while (*pcVar30 != '\0');
          }
          iVar5 = strcmp((char *)paVar21,"GNU.sparse.major");
          if (iVar5 == 0) {
            sVar11 = strlen((char *)entry_00);
            iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
            tar->sparse_gnu_major = (int)iVar12;
            tar->sparse_gnu_pending = '\x01';
          }
          iVar5 = strcmp((char *)paVar21,"GNU.sparse.minor");
          if (iVar5 == 0) {
            sVar11 = strlen((char *)entry_00);
            iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
            tar->sparse_gnu_minor = (int)iVar12;
            tar->sparse_gnu_pending = '\x01';
          }
          iVar5 = strcmp((char *)paVar21,"GNU.sparse.name");
          if (iVar5 == 0) {
            (tar->entry_pathname_override).length = 0;
            sVar11 = strlen((char *)entry_00);
            archive_strncat(local_60,entry_00,sVar11);
          }
          iVar5 = strcmp((char *)paVar21,"GNU.sparse.realsize");
          if (iVar5 == 0) {
LAB_004340d8:
            sVar11 = strlen((char *)entry_00);
            iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
            tar->realsize = iVar12;
            archive_entry_set_size(entry,iVar12);
          }
        }
        else if (bVar3 == 0x4c) {
          iVar5 = strcmp((char *)paVar21,"LIBARCHIVE.creationtime");
          if (iVar5 == 0) {
            pax_time((char *)entry_00,&local_78,&local_80);
            archive_entry_set_birthtime(entry,local_78,local_80);
          }
          auVar32[0] = -(*(char *)&paVar21->archive == 'L');
          auVar32[1] = -(*(char *)((long)&paVar21->archive + 1) == 'I');
          auVar32[2] = -(*(char *)((long)&paVar21->archive + 2) == 'B');
          auVar32[3] = -(*(char *)((long)&paVar21->archive + 3) == 'A');
          auVar32[4] = -(*(char *)((long)&paVar21->archive + 4) == 'R');
          auVar32[5] = -(*(char *)((long)&paVar21->archive + 5) == 'C');
          auVar32[6] = -(*(char *)((long)&paVar21->archive + 6) == 'H');
          auVar32[7] = -(*(char *)((long)&paVar21->archive + 7) == 'I');
          auVar32[8] = -(*(char *)&paVar21->stat == 'V');
          auVar32[9] = -(*(char *)((long)&paVar21->stat + 1) == 'E');
          auVar32[10] = -(*(char *)((long)&paVar21->stat + 2) == '.');
          auVar32[0xb] = -(*(char *)((long)&paVar21->stat + 3) == 'x');
          auVar32[0xc] = -(*(char *)((long)&paVar21->stat + 4) == 'a');
          auVar32[0xd] = -(*(char *)((long)&paVar21->stat + 5) == 't');
          auVar32[0xe] = -(*(char *)((long)&paVar21->stat + 6) == 't');
          auVar32[0xf] = -(*(char *)((long)&paVar21->stat + 7) == 'r');
          auVar33[0] = -((char)paVar21->stat_valid == '.');
          auVar33[1] = 0xff;
          auVar33[2] = 0xff;
          auVar33[3] = 0xff;
          auVar33[4] = 0xff;
          auVar33[5] = 0xff;
          auVar33[6] = 0xff;
          auVar33[7] = 0xff;
          auVar33[8] = 0xff;
          auVar33[9] = 0xff;
          auVar33[10] = 0xff;
          auVar33[0xb] = 0xff;
          auVar33[0xc] = 0xff;
          auVar33[0xd] = 0xff;
          auVar33[0xe] = 0xff;
          auVar33[0xf] = 0xff;
          auVar33 = auVar33 & auVar32;
          if (((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) == 0xffff) &&
             (sVar11 = strlen((char *)paVar21), 0x11 < sVar11)) {
            pbVar28 = (byte *)(pcVar10 + 0x12);
            sVar11 = strlen((char *)pbVar28);
            name = (byte *)malloc(sVar11 + 1);
            pbVar25 = name;
            if (name == (byte *)0x0) {
              name = (byte *)0x0;
            }
            else {
              while (*pbVar28 == 0x25) {
                iVar5 = (int)(char)pbVar28[1];
                if ((pbVar28[1] == 0) || (iVar18 = (int)(char)pbVar28[2], pbVar28[2] == 0))
                goto LAB_0043424a;
                uVar20 = iVar5 - 0x30;
                if (9 < uVar20) {
                  if (iVar5 - 0x41U < 6) {
                    uVar20 = iVar5 - 0x37;
                  }
                  else {
                    uVar20 = iVar5 - 0x57;
                    if (5 < iVar5 - 0x61U) {
                      uVar20 = 0xffffffff;
                    }
                  }
                }
                uVar19 = iVar18 - 0x30;
                if (9 < uVar19) {
                  if (iVar18 - 0x41U < 6) {
                    uVar19 = iVar18 - 0x37;
                  }
                  else {
                    uVar19 = iVar18 - 0x57;
                    if (5 < iVar18 - 0x61U) {
                      uVar19 = 0xffffffff;
                    }
                  }
                }
                if (-1 < (int)(uVar20 | uVar19)) {
                  pbVar28 = pbVar28 + 3;
                  *pbVar25 = (byte)uVar19 | (byte)(uVar20 << 4);
                  pbVar25 = pbVar25 + 1;
                }
                if ((int)(uVar20 | uVar19) < 0) {
LAB_0043424a:
                  bVar3 = *pbVar28;
                  pbVar28 = pbVar28 + 1;
                  *pbVar25 = bVar3;
                  pbVar25 = pbVar25 + 1;
                }
              }
              if (*pbVar28 != 0) goto LAB_0043424a;
              *pbVar25 = 0;
            }
            if (name == (byte *)0x0) {
              wVar7 = L'\0';
              goto LAB_0043485e;
            }
            sVar11 = strlen((char *)entry_00);
            if (base64_decode_decode_table[0x42] != '\x01') {
              base64_decode_decode_table._112_4_ = 0xffffffff;
              base64_decode_decode_table._116_4_ = 0xffffffff;
              base64_decode_decode_table._120_4_ = 0xffffffff;
              base64_decode_decode_table._124_4_ = 0xffffffff;
              base64_decode_decode_table._96_4_ = 0xffffffff;
              base64_decode_decode_table._100_4_ = 0xffffffff;
              base64_decode_decode_table._104_4_ = 0xffffffff;
              base64_decode_decode_table._108_4_ = 0xffffffff;
              base64_decode_decode_table._80_4_ = 0xffffffff;
              base64_decode_decode_table._84_4_ = 0xffffffff;
              base64_decode_decode_table._88_4_ = 0xffffffff;
              base64_decode_decode_table._92_4_ = 0xffffffff;
              base64_decode_decode_table._64_4_ = 0xffffffff;
              base64_decode_decode_table._68_4_ = 0xffffffff;
              base64_decode_decode_table._72_4_ = 0xffffffff;
              base64_decode_decode_table._76_4_ = 0xffffffff;
              base64_decode_decode_table._48_4_ = 0xffffffff;
              base64_decode_decode_table._52_4_ = 0xffffffff;
              base64_decode_decode_table._56_4_ = 0xffffffff;
              base64_decode_decode_table._60_4_ = 0xffffffff;
              base64_decode_decode_table._32_4_ = 0xffffffff;
              base64_decode_decode_table._36_4_ = 0xffffffff;
              base64_decode_decode_table._40_4_ = 0xffffffff;
              base64_decode_decode_table._44_4_ = 0xffffffff;
              base64_decode_decode_table._16_4_ = 0xffffffff;
              base64_decode_decode_table._20_4_ = 0xffffffff;
              base64_decode_decode_table._24_4_ = 0xffffffff;
              base64_decode_decode_table._28_4_ = 0xffffffff;
              base64_decode_decode_table._0_4_ = 0xffffffff;
              base64_decode_decode_table._4_4_ = 0xffffffff;
              base64_decode_decode_table._8_4_ = 0xffffffff;
              base64_decode_decode_table._12_4_ = 0xffffffff;
              lVar14 = 0;
              do {
                base64_decode_decode_table[(byte)(&base64_decode_digits)[lVar14]] = (char)lVar14;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0x40);
            }
            pbVar28 = (byte *)malloc((sVar11 - (sVar11 >> 2)) + 1);
            pbVar25 = pbVar28;
            if (pbVar28 == (byte *)0x0) {
              sVar23 = 0;
              pbVar28 = (byte *)0x0;
            }
            else {
              while (sVar11 != 0) {
                bVar31 = true;
                uVar19 = 0;
                paVar21 = entry_00;
                uVar20 = 0;
                do {
                  while( true ) {
                    entry_00 = paVar21;
                    sVar11 = sVar11 - 1;
                    bVar3 = *(byte *)&entry_00->archive;
                    if ((bVar3 == 0x3d) || (bVar3 == 0x5f)) {
                      sVar11 = 0;
                      goto LAB_00434719;
                    }
                    if (('\x1f' < (char)bVar3) && ((byte)base64_decode_decode_table[bVar3] != 0xff))
                    break;
                    entry_00 = (archive_entry *)((long)&entry_00->archive + 1);
                    paVar21 = entry_00;
                    if (!(bool)(sVar11 != 0 & bVar31)) goto LAB_00434719;
                  }
                  uVar19 = uVar19 << 6 | (uint)(byte)base64_decode_decode_table[bVar3];
                  uVar24 = uVar20 + 1;
                  bVar31 = uVar20 < 3;
                  uVar20 = uVar24;
                } while ((bVar31) &&
                        (paVar21 = (archive_entry *)((long)&entry_00->archive + 1), sVar11 != 0));
                entry_00 = (archive_entry *)((long)&entry_00->archive + 1);
LAB_00434719:
                iVar5 = uVar19 << (('\x04' - (char)uVar20) * '\x06' & 0x1fU);
                if (uVar20 == 2) {
LAB_00434740:
                  *pbVar25 = (byte)((uint)iVar5 >> 0x10);
                }
                else {
                  if (uVar20 == 3) {
LAB_0043473d:
                    pbVar25[1] = (byte)((uint)iVar5 >> 8);
                    goto LAB_00434740;
                  }
                  if (uVar20 == 4) {
                    pbVar25[2] = (byte)iVar5;
                    goto LAB_0043473d;
                  }
                }
                iVar5 = uVar20 * 3 + 3;
                if (-1 < (int)(uVar20 * 3)) {
                  iVar5 = uVar20 * 3;
                }
                pbVar25 = pbVar25 + (iVar5 >> 2);
              }
              sVar23 = (long)pbVar25 - (long)pbVar28;
            }
            if (pbVar28 != (byte *)0x0) {
              archive_entry_xattr_add_entry(entry,(char *)name,pbVar28,sVar23);
              free(name);
              name = pbVar28;
            }
            free(name);
          }
        }
        else if (bVar3 == 0x53) {
          iVar5 = strcmp((char *)paVar21,"SCHILY.acl.access");
          if (iVar5 == 0) {
            if (tar->sconv_acl != (archive_string_conv *)0x0) {
LAB_00434352:
              paVar13 = archive_entry_acl(entry);
              wVar7 = archive_acl_parse_l(paVar13,(char *)entry_00,L'Ā',tar->sconv_acl);
              if (wVar7 == L'\0') goto LAB_0043485e;
              if (wVar7 != L'\xffffffe2') {
                pcVar30 = "Parse error: SCHILY.acl.access";
                goto LAB_00434782;
              }
              pcVar30 = "Can\'t allocate memory for SCHILY.acl.access";
              goto LAB_00434549;
            }
            paVar16 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
            tar->sconv_acl = paVar16;
            if (paVar16 != (archive_string_conv *)0x0) goto LAB_00434352;
          }
          else {
            iVar5 = strcmp((char *)paVar21,"SCHILY.acl.default");
            if (iVar5 != 0) {
              iVar5 = strcmp((char *)paVar21,"SCHILY.devmajor");
              if (iVar5 == 0) {
                sVar11 = strlen((char *)entry_00);
                dVar15 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
                archive_entry_set_rdevmajor(entry,dVar15);
              }
              else {
                iVar5 = strcmp((char *)paVar21,"SCHILY.devminor");
                if (iVar5 == 0) {
                  sVar11 = strlen((char *)entry_00);
                  dVar15 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
                  archive_entry_set_rdevminor(entry,dVar15);
                }
                else {
                  iVar5 = strcmp((char *)paVar21,"SCHILY.fflags");
                  if (iVar5 == 0) {
                    archive_entry_copy_fflags_text(entry,(char *)entry_00);
                  }
                  else {
                    iVar5 = strcmp((char *)paVar21,"SCHILY.dev");
                    if (iVar5 == 0) {
                      sVar11 = strlen((char *)entry_00);
                      dVar15 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
                      archive_entry_set_dev(entry,dVar15);
                    }
                    else {
                      iVar5 = strcmp((char *)paVar21,"SCHILY.ino");
                      if (iVar5 == 0) {
                        sVar11 = strlen((char *)entry_00);
                        iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
                        archive_entry_set_ino(entry,iVar12);
                      }
                      else {
                        iVar5 = strcmp((char *)paVar21,"SCHILY.nlink");
                        if (iVar5 == 0) {
                          sVar11 = strlen((char *)entry_00);
                          iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
                          archive_entry_set_nlink(entry,(uint)iVar12);
                        }
                        else {
                          iVar5 = strcmp((char *)paVar21,"SCHILY.realsize");
                          if (iVar5 == 0) goto LAB_004340d8;
                          iVar5 = strcmp((char *)paVar21,"SUN.holesdata");
                          if (iVar5 == 0) {
                            wVar6 = solaris_sparse_parse(a,tar,entry_00,p);
                            wVar7 = L'\0';
                            if ((wVar6 < L'\0') && (wVar7 = L'\xffffffe2', wVar6 != L'\xffffffe2'))
                            {
                              archive_set_error(&a->archive,-1,"Parse error: SUN.holesdata");
                              wVar7 = wVar6;
                            }
                            goto LAB_0043485e;
                          }
                        }
                      }
                    }
                  }
                }
              }
              goto LAB_00434853;
            }
            if (tar->sconv_acl == (archive_string_conv *)0x0) {
              paVar16 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
              tar->sconv_acl = paVar16;
              if (paVar16 == (archive_string_conv *)0x0) goto LAB_00434550;
            }
            paVar13 = archive_entry_acl(entry);
            wVar7 = archive_acl_parse_l(paVar13,(char *)entry_00,L'Ȁ',tar->sconv_acl);
            if (wVar7 == L'\0') goto LAB_0043485e;
            if (wVar7 != L'\xffffffe2') {
              pcVar30 = "Parse error: SCHILY.acl.default";
LAB_00434782:
              archive_set_error(&a->archive,-1,pcVar30);
              goto LAB_0043485e;
            }
            pcVar30 = "Can\'t allocate memory for SCHILY.acl.default";
LAB_00434549:
            archive_set_error(&a->archive,0xc,pcVar30);
          }
LAB_00434550:
          wVar7 = L'\xffffffe2';
          goto LAB_0043485e;
        }
        goto LAB_00434853;
      }
      switch(bVar3) {
      case 0x61:
        iVar5 = strcmp((char *)paVar21,"atime");
        if (iVar5 == 0) {
          pax_time((char *)entry_00,&local_78,&local_80);
          archive_entry_set_atime(entry,local_78,local_80);
        }
        break;
      default:
        wVar7 = L'\0';
        goto LAB_0043485e;
      case 99:
        iVar5 = strcmp((char *)paVar21,"ctime");
        if (iVar5 == 0) {
          pax_time((char *)entry_00,&local_78,&local_80);
          archive_entry_set_ctime(entry,local_78,local_80);
        }
        break;
      case 0x67:
        iVar5 = strcmp((char *)paVar21,"gid");
        if (iVar5 == 0) {
          sVar11 = strlen((char *)entry_00);
          iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
          archive_entry_set_gid(entry,iVar12);
        }
        else {
          iVar5 = strcmp((char *)paVar21,"gname");
          if (iVar5 == 0) {
            (tar->entry_gname).length = 0;
            sVar23 = strlen((char *)entry_00);
            paVar17 = local_70;
            goto LAB_00433f4f;
          }
        }
        break;
      case 0x68:
        iVar5 = strcmp((char *)paVar21,"hdrcharset");
        if (iVar5 == 0) {
          iVar5 = strcmp((char *)entry_00,"BINARY");
          if (iVar5 == 0) {
            tar->pax_hdrcharset_binary = 1;
          }
          else {
            iVar5 = strcmp((char *)entry_00,"ISO-IR 10646 2000 UTF-8");
            if (iVar5 == 0) {
              tar->pax_hdrcharset_binary = 0;
            }
          }
        }
        break;
      case 0x6c:
        iVar5 = strcmp((char *)paVar21,"linkpath");
        if (iVar5 == 0) {
          (tar->entry_linkpath).length = 0;
          sVar23 = strlen((char *)entry_00);
          paVar17 = local_50;
LAB_00433f4f:
          archive_strncat(paVar17,entry_00,sVar23);
        }
        break;
      case 0x6d:
        iVar5 = strcmp((char *)paVar21,"mtime");
        if (iVar5 == 0) {
          pax_time((char *)entry_00,&local_78,&local_80);
          archive_entry_set_mtime(entry,local_78,local_80);
        }
        break;
      case 0x70:
        iVar5 = strcmp((char *)paVar21,"path");
        if (iVar5 == 0) {
          (tar->entry_pathname).length = 0;
          sVar23 = strlen((char *)entry_00);
          paVar17 = local_68;
          goto LAB_00433f4f;
        }
        break;
      case 0x73:
        iVar5 = strcmp((char *)paVar21,"size");
        if (iVar5 == 0) {
          sVar11 = strlen((char *)entry_00);
          iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
          tar->entry_bytes_remaining = iVar12;
          if (tar->realsize < 0) {
            archive_entry_set_size(entry,iVar12);
            tar->realsize = tar->entry_bytes_remaining;
          }
        }
        break;
      case 0x75:
        iVar5 = strcmp((char *)paVar21,"uid");
        if (iVar5 == 0) {
          sVar11 = strlen((char *)entry_00);
          iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
          archive_entry_set_uid(entry,iVar12);
        }
        else {
          iVar5 = strcmp((char *)paVar21,"uname");
          if (iVar5 == 0) {
            (tar->entry_uname).length = 0;
            sVar23 = strlen((char *)entry_00);
            paVar17 = local_58;
            goto LAB_00433f4f;
          }
        }
      }
LAB_00434853:
      wVar7 = L'\0';
LAB_0043485e:
      if (wVar7 == L'\xffffffe2') goto LAB_00434af9;
      if (wVar7 <= wVar8) {
        wVar8 = wVar7;
      }
      pcVar30 = local_38 + uVar29;
      pcVar9 = pcVar9 + -uVar29;
      paVar17 = local_68;
      paVar26 = local_70;
    } while (pcVar9 != (char *)0x0);
  }
  local_70 = paVar26;
  local_68 = paVar17;
  if (tar->pax_hdrcharset_binary == 0) {
    paVar16 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
    if (paVar16 == (archive_string_conv *)0x0) {
LAB_00434af9:
      wVar7 = L'\xffffffe2';
      goto LAB_004348f4;
    }
    if (tar->compat_2x != 0) {
      archive_string_conversion_set_opt(paVar16,L'\x01');
    }
  }
  else {
    paVar16 = tar->opt_sconv;
  }
  sVar23 = (tar->entry_gname).length;
  if ((sVar23 != 0) &&
     (wVar7 = _archive_entry_copy_gname_l(entry,local_70->s,sVar23,paVar16), wVar7 != L'\0')) {
    wVar8 = set_conversion_failed_error(a,paVar16,"Gname");
    wVar7 = L'\xffffffe2';
    if (wVar8 == L'\xffffffe2') goto LAB_004348f4;
    archive_entry_copy_gname(entry,local_70->s);
  }
  sVar23 = (tar->entry_linkpath).length;
  if ((sVar23 != 0) &&
     (wVar7 = _archive_entry_copy_link_l(entry,local_50->s,sVar23,paVar16), wVar7 != L'\0')) {
    wVar8 = set_conversion_failed_error(a,paVar16,"Linkname");
    wVar7 = L'\xffffffe2';
    if (wVar8 == L'\xffffffe2') goto LAB_004348f4;
    archive_entry_copy_link(entry,local_50->s);
  }
  paVar17 = local_60;
  if (((tar->entry_pathname_override).length == 0) &&
     (paVar17 = local_68, (tar->entry_pathname).length == 0)) {
    paVar17 = (archive_string *)0x0;
  }
  if ((paVar17 != (archive_string *)0x0) &&
     (local_60 = paVar17,
     wVar7 = _archive_entry_copy_pathname_l(entry,paVar17->s,paVar17->length,paVar16),
     wVar7 != L'\0')) {
    wVar8 = set_conversion_failed_error(a,paVar16,"Pathname");
    wVar7 = L'\xffffffe2';
    if (wVar8 == L'\xffffffe2') goto LAB_004348f4;
    archive_entry_copy_pathname(entry,local_60->s);
  }
  sVar23 = (tar->entry_uname).length;
  wVar7 = wVar8;
  if ((sVar23 != 0) &&
     (wVar8 = _archive_entry_copy_uname_l(entry,local_58->s,sVar23,paVar16), wVar8 != L'\0')) {
    wVar8 = set_conversion_failed_error(a,paVar16,"Uname");
    wVar7 = L'\xffffffe2';
    if (wVar8 != L'\xffffffe2') {
      archive_entry_copy_uname(entry,local_58->s);
      wVar7 = wVar8;
    }
  }
LAB_004348f4:
  if (wVar4 < wVar7) {
    wVar7 = wVar4;
  }
  tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
  return wVar7;
}

Assistant:

static int
header_pax_extensions(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err, err2;

	err = read_body_to_string(a, tar, &(tar->pax_header), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);

	/* Parse the next header. */
	err = tar_read_header(a, tar, entry, unconsumed);
	if ((err != ARCHIVE_OK) && (err != ARCHIVE_WARN))
		return (err);

	/*
	 * TODO: Parse global/default options into 'entry' struct here
	 * before handling file-specific options.
	 *
	 * This design (parse standard header, then overwrite with pax
	 * extended attribute data) usually works well, but isn't ideal;
	 * it would be better to parse the pax extended attributes first
	 * and then skip any fields in the standard header that were
	 * defined in the pax header.
	 */
	err2 = pax_header(a, tar, entry, tar->pax_header.s);
	err =  err_combine(err, err2);
	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);
	return (err);
}